

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_negate(secp256k1_context *ctx,uchar *seckey)

{
  ulong uVar1;
  uint uVar2;
  int overflow;
  int local_44;
  secp256k1_scalar local_40;
  
  if (seckey == (uchar *)0x0) {
    secp256k1_ec_seckey_negate_cold_1();
    uVar2 = 0;
  }
  else {
    secp256k1_scalar_set_b32(&local_40,seckey,&local_44);
    uVar2 = (uint)(((local_40.d[2] != 0 || local_40.d[3] != 0) ||
                   (local_40.d[1] != 0 || local_40.d[0] != 0)) && local_44 == 0);
    uVar1 = (ulong)(uVar2 ^ 1) - 1;
    local_40.d[0] = local_40.d[0] & uVar1;
    local_40.d[1] = local_40.d[1] & uVar1;
    local_40.d[2] = local_40.d[2] & uVar1;
    local_40.d[3] = uVar1 & local_40.d[3];
    secp256k1_scalar_negate(&local_40,&local_40);
    secp256k1_scalar_get_b32(seckey,&local_40);
  }
  return uVar2;
}

Assistant:

int secp256k1_ec_seckey_negate(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_negate(&sec, &sec);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}